

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  long lVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long lVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
  if (0 < *(int *)(lVar3 + 0x2c)) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      if ((*(int *)(*(long *)(lVar3 + 0x30) + 0x30 + lVar5) == 2) &&
         (cVar1 = (**(code **)(*plVar4 + 0x28))(plVar4,message,*(long *)(lVar3 + 0x30) + lVar5),
         cVar1 == '\0')) {
        return false;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x78;
    } while (lVar6 < *(int *)(lVar3 + 0x2c));
  }
  (**(code **)(*plVar4 + 0x60))(plVar4,message);
  return true;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                          .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}